

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Bac_ManWriteConcat(Bac_Ntk_t *p,int iStart,int nObjs)

{
  Vec_Str_t *p_00;
  char cVar1;
  int iVar2;
  Bac_NameType_t BVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char local_8c;
  uint local_74;
  uint local_40;
  int f;
  int nBits;
  int Digit;
  int fBinary;
  int NameId;
  int k;
  int b;
  int e;
  int i;
  Vec_Str_t *vStr;
  int nObjs_local;
  int iStart_local;
  Bac_Ntk_t *p_local;
  
  p_00 = p->pDesign->vOut;
  if (nObjs < 1) {
    __assert_fail("nObjs >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x11e,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
  }
  if (nObjs == 1) {
    Bac_ManWriteSig(p,iStart);
  }
  else {
    Vec_StrPrintStr(p_00,"{");
    iVar2 = Bac_ObjIsBo(p,iStart);
    if (iVar2 == 0) {
      iVar2 = Bac_ObjIsBi(p,iStart);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                      ,0x187,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
      }
      k = (iStart - nObjs) + 1;
      while (k <= iStart) {
        cVar1 = Vec_StrEntryLast(p_00);
        if (cVar1 != '{') {
          Vec_StrPrintStr(p_00,", ");
        }
        iVar2 = Bac_ObjFanin(p,k);
        iVar2 = Bac_ObjGetConst(p,iVar2);
        NameId = k;
        if (iVar2 == 0) {
          do {
            NameId = NameId + 1;
            if (iStart < NameId) break;
            iVar2 = Bac_ObjFanin(p,NameId);
            iVar4 = Bac_ObjFanin(p,k);
          } while (iVar2 == iVar4);
          if (k + 2 < NameId) {
            Vec_StrPrintNum(p_00,NameId - k);
            Vec_StrPrintStr(p_00,"{");
            Bac_ManWriteSig(p,k);
            Vec_StrPrintStr(p_00,"}");
            k = NameId;
          }
          else {
            iVar2 = Bac_ObjFanin(p,k);
            iVar4 = Bac_ObjName(p,iVar2);
            BVar3 = Bac_NameType(iVar4);
            iVar2 = k;
            if (BVar3 == BAC_NAME_BIN) {
              iVar2 = Abc_Lit2Var2(iVar4);
              Bac_ManWriteVar(p,iVar2);
              k = k + 1;
            }
            else {
              do {
                iVar4 = iVar2;
                NameId = iVar4 + 1;
                if (iStart < NameId) break;
                iVar5 = Bac_ObjFanin(p,k);
                iVar6 = Bac_ObjFanin(p,NameId);
                iVar2 = NameId;
              } while (iVar5 - iVar6 == NameId - k);
              iVar2 = Bac_ObjFanin(p,k);
              iVar2 = Bac_ManFindRealNameId(p,iVar2);
              Bac_ManWriteVar(p,iVar2);
              if (NameId == k + 1) {
                iVar2 = Bac_ObjFanin(p,k);
                iVar2 = Bac_ManFindRealIndex(p,iVar2);
                Bac_ManWriteRange(p,iVar2,-1);
              }
              else {
                iVar2 = Bac_ObjFanin(p,iVar4);
                BVar3 = Bac_ObjNameType(p,iVar2);
                if (BVar3 == BAC_NAME_BIN) {
                  __assert_fail("Bac_ObjNameType(p, f) != BAC_NAME_BIN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                                ,0x17f,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
                }
                BVar3 = Bac_ObjNameType(p,iVar2);
                if ((BVar3 == BAC_NAME_INDEX) ||
                   (iVar4 = Bac_ObjGetRange(p,iVar2), iVar4 != NameId - k)) {
                  iVar2 = Bac_ManFindRealIndex(p,iVar2);
                  iVar4 = Bac_ObjFanin(p,k);
                  iVar4 = Bac_ManFindRealIndex(p,iVar4);
                  Bac_ManWriteRange(p,iVar2,iVar4);
                }
              }
              k = NameId;
            }
          }
        }
        else {
          iVar2 = Bac_ObjFanin(p,k);
          nBits = Bac_ObjIsConstBin(p,iVar2 + -1);
          while (NameId = NameId + 1, NameId <= iStart) {
            iVar2 = Bac_ObjFanin(p,NameId);
            iVar2 = Bac_ObjGetConst(p,iVar2);
            if (iVar2 == 0) break;
            iVar2 = Bac_ObjFanin(p,NameId);
            iVar2 = Bac_ObjIsConstBin(p,iVar2 + -1);
            if (iVar2 == 0) {
              nBits = 0;
            }
          }
          Vec_StrPrintNum(p_00,NameId - k);
          if ((nBits == 0) || (NameId - k < 9)) {
            Vec_StrPrintStr(p_00,"\'b");
            for (fBinary = k; fBinary < NameId; fBinary = fBinary + 1) {
              iVar2 = Bac_ObjFanin(p,fBinary);
              Bac_ManWriteConstBit(p,iVar2,0);
            }
          }
          else {
            f = 0;
            if ((NameId - k & 3U) == 0) {
              local_74 = 4;
            }
            else {
              local_74 = NameId - k & 3;
            }
            local_40 = local_74;
            Vec_StrPrintStr(p_00,"\'h");
            for (fBinary = k; fBinary < NameId; fBinary = fBinary + 1) {
              iVar2 = Bac_ObjFanin(p,fBinary);
              iVar2 = Bac_ObjGetConst(p,iVar2);
              iVar2 = f * 2 + iVar2;
              f = iVar2 + -6;
              if (0xf < f) {
                __assert_fail("Digit < 16",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x14b,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
              }
              local_40 = local_40 - 1;
              if (local_40 == 0) {
                local_8c = (char)iVar2;
                if (f < 10) {
                  local_8c = local_8c + '*';
                }
                else {
                  local_8c = local_8c + 'Q';
                }
                Vec_StrPush(p_00,local_8c);
                local_40 = 4;
                f = 0;
              }
            }
            if (local_40 != 4) {
              __assert_fail("nBits == 4",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x153,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
            }
            if (f != 0) {
              __assert_fail("Digit == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x154,"void Bac_ManWriteConcat(Bac_Ntk_t *, int, int)");
            }
          }
          k = NameId;
        }
      }
    }
    else {
      b = iStart + nObjs;
      while (b = b + -1, iStart <= b) {
        BVar3 = Bac_ObjNameType(p,b);
        if (BVar3 != BAC_NAME_INDEX) {
          cVar1 = Vec_StrEntryLast(p_00);
          if (cVar1 != '{') {
            Vec_StrPrintStr(p_00,", ");
          }
          iVar2 = Bac_ManFindRealNameId(p,b);
          Bac_ManWriteVar(p,iVar2);
        }
      }
    }
    Vec_StrPrintStr(p_00,"}");
  }
  return;
}

Assistant:

static inline void Bac_ManWriteConcat( Bac_Ntk_t * p, int iStart, int nObjs )
{
    Vec_Str_t * vStr = p->pDesign->vOut; 
    assert( nObjs >= 1 );
    if ( nObjs == 1 )
    {
        Bac_ManWriteSig( p, iStart );
        return;
    }
    Vec_StrPrintStr( vStr, "{" );
    if ( Bac_ObjIsBo(p, iStart) ) // box output
    {
        int i;
        for ( i = iStart + nObjs - 1; i >= iStart; i-- )
        {
            if ( Bac_ObjNameType(p, i) == BAC_NAME_INDEX )
                continue;
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, i) );
        }
    }
    else if ( Bac_ObjIsBi(p, iStart) ) // box input
    {
        int e, b, k, NameId;
        for ( e = iStart - nObjs + 1; e <= iStart; )
        {
            if ( Vec_StrEntryLast(vStr) != '{' )
                Vec_StrPrintStr( vStr, ", " );
            // write constant
            if ( Bac_ObjGetConst(p, Bac_ObjFanin(p, e)) )
            {
                int fBinary = Bac_ObjIsConstBin(p, Bac_ObjFanin(p, e)-1);                
                for ( b = e + 1; b <= iStart; b++ )
                {
                    if ( !Bac_ObjGetConst(p, Bac_ObjFanin(p, b)) )
                        break;
                    if ( !Bac_ObjIsConstBin(p, Bac_ObjFanin(p, b)-1) )
                        fBinary = 0;
                }
                Vec_StrPrintNum( vStr, b - e );
                if ( fBinary && b - e > 8 ) // write hex if more than 8 bits
                {
                    int Digit = 0, nBits = ((b - e) & 3) ? (b - e) & 3 : 4;
                    Vec_StrPrintStr( vStr, "\'h" );
                    for ( k = e; k < b; k++ )
                    {
                        Digit = 2*Digit + Bac_ObjGetConst(p, Bac_ObjFanin(p, k)) - BAC_BOX_CF;
                        assert( Digit < 16 );
                        if ( --nBits == 0 )
                        {
                            Vec_StrPush( vStr, (char)(Digit < 10 ? '0' + Digit : 'a' + Digit - 10) );
                            nBits = 4;
                            Digit = 0;
                        }
                    }
                    assert( nBits == 4 );
                    assert( Digit == 0 );
                }
                else
                {
                    Vec_StrPrintStr( vStr, "\'b" );
                    for ( k = e; k < b; k++ )
                        Bac_ManWriteConstBit( p, Bac_ObjFanin(p, k), 0 );
                }
                e = b;
                continue;
            }
            // try replication
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, b) != Bac_ObjFanin(p, e) )
                    break;
            if ( b > e + 2 ) // more than two
            {
                Vec_StrPrintNum( vStr, b - e );
                Vec_StrPrintStr( vStr, "{" );
                Bac_ManWriteSig( p, e );
                Vec_StrPrintStr( vStr, "}" );
                e = b;
                continue;
            }
            NameId = Bac_ObjName(p, Bac_ObjFanin(p, e));
            if ( Bac_NameType(NameId) == BAC_NAME_BIN )
            {
                Bac_ManWriteVar( p, Abc_Lit2Var2(NameId) );
                e++;
                continue;
            }
            // find end of the slice
            for ( b = e + 1; b <= iStart; b++ )
                if ( Bac_ObjFanin(p, e) - Bac_ObjFanin(p, b) != b - e )
                    break;
            // write signal name
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, Bac_ObjFanin(p, e)) );
            if ( b == e + 1 ) // literal
                Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)), -1 );
            else // slice or complete variable
            {
                // consider first variable of the slice
                int f = Bac_ObjFanin( p, b-1 );
                assert( Bac_ObjNameType(p, f) != BAC_NAME_BIN );
                if ( Bac_ObjNameType(p, f) == BAC_NAME_INDEX || Bac_ObjGetRange(p, f) != b - e ) // slice
                    Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, f), Bac_ManFindRealIndex(p, Bac_ObjFanin(p, e)) );
                // else this is complete variable
            }
            e = b;
        }
    }
    else assert( 0 );
    Vec_StrPrintStr( vStr, "}" );
}